

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

void __thiscall R2Rect::AddPoint(R2Rect *this,R2Point *p)

{
  VType *pVVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  R1Interval *pRVar5;
  VType *pVVar6;
  R1Interval *pRVar7;
  
  dVar2 = p->c_[0];
  dVar3 = this->bounds_[0].bounds_.c_[0];
  dVar4 = this->bounds_[0].bounds_.c_[1];
  pVVar1 = this->bounds_[0].bounds_.c_ + 1;
  if (dVar3 <= dVar4) {
    pVVar6 = (VType *)this;
    if ((dVar3 <= dVar2) && (pVVar6 = pVVar1, dVar2 <= dVar4)) goto LAB_0019a462;
  }
  else {
    this->bounds_[0].bounds_.c_[0] = dVar2;
    pVVar6 = pVVar1;
  }
  *pVVar6 = dVar2;
LAB_0019a462:
  dVar2 = p->c_[1];
  dVar3 = this->bounds_[1].bounds_.c_[0];
  dVar4 = this->bounds_[1].bounds_.c_[1];
  pRVar7 = (R1Interval *)(this->bounds_[1].bounds_.c_ + 1);
  if (dVar3 <= dVar4) {
    pRVar5 = this->bounds_ + 1;
    if ((dVar3 <= dVar2) && (pRVar5 = pRVar7, dVar2 <= dVar4)) {
      return;
    }
  }
  else {
    this->bounds_[1].bounds_.c_[0] = dVar2;
    pRVar5 = pRVar7;
  }
  (pRVar5->bounds_).c_[0] = dVar2;
  return;
}

Assistant:

T operator[](int b) const {
    S2_DCHECK_GE(b, 0);
    S2_DCHECK_LT(b, SIZE);
    return static_cast<const D&>(*this).Data()[b];
  }